

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

void cpu_get_tb_cpu_state
               (CPUTriCoreState *env,target_ulong_conflict *pc,target_ulong_conflict *cs_base,
               uint32_t *flags)

{
  uint32_t *flags_local;
  target_ulong_conflict *cs_base_local;
  target_ulong_conflict *pc_local;
  CPUTriCoreState *env_local;
  
  *pc = env->PC;
  *cs_base = 0;
  *flags = 0;
  return;
}

Assistant:

static inline void cpu_get_tb_cpu_state(CPUSPARCState *env, target_ulong *pc,
                                        target_ulong *cs_base, uint32_t *pflags)
{
    uint32_t flags;
    *pc = env->pc;
    *cs_base = env->npc;
    flags = cpu_mmu_index(env, false);
    if (cpu_supervisor_mode(env)) {
        flags |= TB_FLAG_SUPER;
    }
#ifdef TARGET_SPARC64
    if (env->pstate & PS_AM) {
        flags |= TB_FLAG_AM_ENABLED;
    }
    if ((env->def.features & CPU_FEATURE_FLOAT)
        && (env->pstate & PS_PEF)
        && (env->fprs & FPRS_FEF)) {
        flags |= TB_FLAG_FPU_ENABLED;
    }
    flags |= env->asi << TB_FLAG_ASI_SHIFT;
#else
    if ((env->def.features & CPU_FEATURE_FLOAT) && env->psref) {
        flags |= TB_FLAG_FPU_ENABLED;
    }
#endif
    *pflags = flags;
}